

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O1

void __thiscall
Diligent::
RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
::RefCntAutoPtr(RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
                *this,ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
                      *pObj)

{
  char (*in_RCX) [26];
  string msg;
  string local_28;
  
  this->m_pObject = pObj;
  if (pObj != (ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
               *)0x0) {
    if ((pObj->
        super_DeviceObjectBase<Diligent::IDeviceObject,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceObjectAttribs>
        ).super_ObjectBase<Diligent::IDeviceObject>.super_RefCountedObject<Diligent::IDeviceObject>.
        m_pRefCounters == (RefCountersImpl *)0x0) {
      FormatString<char[26],char[26]>
                (&local_28,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_pRefCounters != nullptr",in_RCX);
      DebugAssertionFailed
                (local_28._M_dataplus._M_p,"AddRef",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/RefCountedObjectImpl.hpp"
                 ,0x221);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_28._M_dataplus._M_p != &local_28.field_2) {
        operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
      }
    }
    RefCountersImpl::AddStrongRef
              ((pObj->
               super_DeviceObjectBase<Diligent::IDeviceObject,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceObjectAttribs>
               ).super_ObjectBase<Diligent::IDeviceObject>.
               super_RefCountedObject<Diligent::IDeviceObject>.m_pRefCounters);
  }
  return;
}

Assistant:

explicit RefCntAutoPtr(T* pObj) noexcept :
        m_pObject{pObj}
    {
        if (m_pObject)
            m_pObject->AddRef();
    }